

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *__name;
  int *piVar2;
  string local_70 [36];
  int local_4c;
  undefined1 local_48 [4];
  int err;
  string *local_20;
  string *directory_local;
  file_handle *this_local;
  
  local_20 = (string *)__file;
  directory_local = (string *)this;
  open(this,__file,__oflag);
  path_abi_cxx11_((file_handle *)local_48);
  __name = (char *)std::__cxx11::string::c_str();
  iVar1 = ::unlink(__name);
  std::__cxx11::string::~string((string *)local_48);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_4c = iVar1;
    std::__cxx11::string::string(local_70,local_20);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"Unable to create temporary file in directory",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  return iVar1;
}

Assistant:

void file_handle::open (temporary const, std::string const & directory) {
            this->open (unique{}, directory);
            if (::unlink (this->path ().c_str ()) == -1) {
                int const err = errno;
                raise_file_error (err, "Unable to create temporary file in directory", directory);
            }
        }